

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeSignedInteger(Parser *this,int *output,ErrorMaker error)

{
  ErrorMaker error_00;
  bool bVar1;
  int iVar2;
  uint64_t local_58;
  uint64_t value;
  uint64_t local_40;
  uint64_t max_value;
  int *piStack_30;
  bool is_negative;
  int *output_local;
  Parser *this_local;
  ErrorMaker error_local;
  
  error_local.field_0 = (anon_union_8_2_7976e4ae_for_ErrorMaker_0)error.func_;
  this_local = (Parser *)error.field_0;
  max_value._7_1_ = 0;
  piStack_30 = output;
  output_local = (int *)this;
  iVar2 = std::numeric_limits<int>::max();
  local_40 = (uint64_t)iVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&value,"-");
  bVar1 = TryConsume(this,_value);
  if (bVar1) {
    max_value._7_1_ = 1;
    local_40 = local_40 + 1;
  }
  local_58 = 0;
  error_00.func_ = (_func_string_void_ptr *)error_local.field_0.error_;
  error_00.field_0.error_ = (char *)this_local;
  bVar1 = ConsumeInteger64(this,local_40,&local_58,error_00);
  if (bVar1) {
    if ((max_value._7_1_ & 1) != 0) {
      local_58 = -local_58;
    }
    *piStack_30 = (int)local_58;
    error_local.func_._7_1_ = true;
  }
  else {
    error_local.func_._7_1_ = false;
  }
  return error_local.func_._7_1_;
}

Assistant:

bool Parser::ConsumeSignedInteger(int* output, ErrorMaker error) {
  bool is_negative = false;
  uint64_t max_value = std::numeric_limits<int32_t>::max();
  if (TryConsume("-")) {
    is_negative = true;
    max_value += 1;
  }
  uint64_t value = 0;
  DO(ConsumeInteger64(max_value, &value, error));
  if (is_negative) value *= -1;
  *output = value;
  return true;
}